

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O3

void lysp_import_free(lysf_ctx *ctx,lysp_import *import)

{
  lysp_ext_instance *plVar1;
  long lVar2;
  lysp_ext_instance *plVar3;
  
  lydict_remove(ctx->ctx,import->name);
  lydict_remove(ctx->ctx,import->prefix);
  lydict_remove(ctx->ctx,import->dsc);
  lydict_remove(ctx->ctx,import->ref);
  plVar1 = import->exts;
  if (plVar1 != (lysp_ext_instance *)0x0) {
    plVar3 = (lysp_ext_instance *)0xffffffffffffffff;
    lVar2 = 0;
    do {
      plVar3 = (lysp_ext_instance *)((long)&plVar3->name + 1);
      if (plVar1[-1].exts <= plVar3) {
        free(&plVar1[-1].exts);
        return;
      }
      plVar1 = (lysp_ext_instance *)((long)&plVar1->name + lVar2);
      lVar2 = lVar2 + 0x70;
      lysp_ext_instance_free(ctx,plVar1);
      plVar1 = import->exts;
    } while (plVar1 != (lysp_ext_instance *)0x0);
  }
  return;
}

Assistant:

static void
lysp_import_free(struct lysf_ctx *ctx, struct lysp_import *import)
{
    /* imported module is freed directly from the context's list */
    lydict_remove(ctx->ctx, import->name);
    lydict_remove(ctx->ctx, import->prefix);
    lydict_remove(ctx->ctx, import->dsc);
    lydict_remove(ctx->ctx, import->ref);
    FREE_ARRAY(ctx, import->exts, lysp_ext_instance_free);
}